

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile(TiledRgbaInputFile *this,char *name,int numThreads)

{
  RgbaChannels RVar1;
  TiledInputFile *this_00;
  FromYa *this_01;
  allocator<char> local_21;
  
  this->_vptr_TiledRgbaInputFile = (_func_int **)&PTR__TiledRgbaInputFile_004217c0;
  this_00 = (TiledInputFile *)operator_new(0x10);
  TiledInputFile::TiledInputFile(this_00,name,numThreads);
  this->_inputFile = this_00;
  this->_fromYa = (FromYa *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->_channelNamePrefix,"",&local_21);
  RVar1 = channels(this);
  if (WRITE_RGBA < RVar1) {
    this_01 = (FromYa *)operator_new(0x78);
    FromYa::FromYa(this_01,this->_inputFile);
    this->_fromYa = this_01;
  }
  return;
}

Assistant:

TiledRgbaInputFile::TiledRgbaInputFile (const char name[], int numThreads):
    _inputFile (new TiledInputFile (name, numThreads)),
    _fromYa (0),
    _channelNamePrefix ("")
{
    if (channels() & WRITE_Y)
	_fromYa = new FromYa (*_inputFile);
}